

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O2

double cupdlp_dcs_norm(cupdlp_dcs *A)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = -1.0;
  if (((A != (cupdlp_dcs *)0x0) && (A->nz == -1)) && (A->x != (double *)0x0)) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)A->n;
    if (A->n < 1) {
      uVar3 = uVar4;
    }
    dVar6 = 0.0;
    while (uVar4 != uVar3) {
      piVar1 = A->p + uVar4;
      lVar2 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      dVar7 = 0.0;
      for (lVar5 = (long)*piVar1; lVar5 < A->p[lVar2]; lVar5 = lVar5 + 1) {
        dVar7 = dVar7 + ABS(A->x[lVar5]);
      }
      if (dVar6 <= dVar7) {
        dVar6 = dVar7;
      }
    }
  }
  return dVar6;
}

Assistant:

double cupdlp_dcs_norm(const cupdlp_dcs *A) {
  int p, j, n, *Ap;
  double *Ax;
  double nrm = 0, s;
  if (!IS_CSC(A) || !A->x) return (-1); /* check inputs */
  n = A->n;
  Ap = A->p;
  Ax = A->x;
  for (j = 0; j < n; j++) {
    for (s = 0, p = Ap[j]; p < Ap[j + 1]; p++) s += fabs(Ax[p]);
    nrm = MAX(nrm, s);
  }
  return (nrm);
}